

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demangle.cc
# Opt level: O0

bool google::ParseTwoCharToken(State *state,char *two_char_token)

{
  char *two_char_token_local;
  State *state_local;
  bool local_1;
  
  if ((*state->mangled_cur == *two_char_token) && (state->mangled_cur[1] == two_char_token[1])) {
    state->mangled_cur = state->mangled_cur + 2;
    local_1 = true;
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

static bool ParseTwoCharToken(State *state, const char *two_char_token) {
  if (state->mangled_cur[0] == two_char_token[0] &&
      state->mangled_cur[1] == two_char_token[1]) {
    state->mangled_cur += 2;
    return true;
  }
  return false;
}